

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O0

void __thiscall Bitmap::setPixelValue(Bitmap *this,int32_t pixel,bool value)

{
  byte local_1e;
  uint8_t data;
  uint8_t mask;
  int32_t index;
  bool value_local;
  int32_t pixel_local;
  Bitmap *this_local;
  
  local_1e = (byte)(0x80 >> ((byte)pixel & 7));
  if ((uint)pixel < (uint)this->length) {
    if (value) {
      local_1e = this->data[pixel / 8] | local_1e;
    }
    else {
      local_1e = this->data[pixel / 8] & (local_1e ^ 0xff);
    }
    this->data[pixel / 8] = local_1e;
  }
  return;
}

Assistant:

void Bitmap::setPixelValue(const int32_t pixel, const bool value)
{
   const int32_t index = pixel / 8;
   const uint8_t mask = (0x80 >> (pixel & 7));
   uint8_t data;

   //ignore all pixel that does not fit onto the lable
   if ((uint32_t)pixel < this->length)
   {
      //set pixel value by read-modify-write
      //read respective byte
      data = this->data[index];
      //modify respective bit
      if (value == false)
      {
         data = data & ~mask; //clear
      }
      else
      {
         data = data | mask; //clear
      }
      //write back respective byte
      this->data[index] = data;
   }
}